

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O3

void helper_sve_trn_p_aarch64(void *vd,void *vn,void *vm,uint32_t pred_desc)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = pred_desc >> 10 & 3;
  uVar4 = 1 << (sbyte)uVar2;
  bVar1 = (byte)((int)(pred_desc << 0x13) >> 0x1f) & (byte)uVar4;
  uVar6 = even_bit_esz_masks[uVar2] << (bVar1 & 0x3f);
  uVar3 = 0;
  uVar5 = (ulong)uVar4;
  if ((pred_desc >> 0xc & 1) != 0) {
    uVar5 = uVar3;
  }
  do {
    *(ulong *)((long)vd + uVar3 * 8) =
         ((*(ulong *)((long)vm + uVar3 * 8) & uVar6) << ((byte)uVar5 & 0x3f)) +
         ((*(ulong *)((long)vn + uVar3 * 8) & uVar6) >> (bVar1 & 0x3f));
    uVar3 = uVar3 + 1;
  } while ((pred_desc & 0x1f) + 9 >> 3 != uVar3);
  return;
}

Assistant:

void HELPER(sve_trn_p)(void *vd, void *vn, void *vm, uint32_t pred_desc)
{
    intptr_t oprsz = extract32(pred_desc, 0, SIMD_OPRSZ_BITS) + 2;
    uintptr_t esz = extract32(pred_desc, SIMD_DATA_SHIFT, 2);
    bool odd = extract32(pred_desc, SIMD_DATA_SHIFT + 2, 1);
    uint64_t *d = vd, *n = vn, *m = vm;
    uint64_t mask;
    int shr, shl;
    intptr_t i;

    shl = 1 << esz;
    shr = 0;
    mask = even_bit_esz_masks[esz];
    if (odd) {
        mask <<= shl;
        shr = shl;
        shl = 0;
    }

    for (i = 0; i < DIV_ROUND_UP(oprsz, 8); i++) {
        uint64_t nn = (n[i] & mask) >> shr;
        uint64_t mm = (m[i] & mask) << shl;
        d[i] = nn + mm;
    }
}